

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateIntersectionId
          (ValidationState_t *_,Instruction *inst,uint32_t intersection_index)

{
  bool bVar1;
  uint id;
  uint32_t uVar2;
  Op opcode;
  int32_t iVar3;
  DiagnosticStream DStack_1f8;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,3);
  uVar2 = ValidationState_t::GetTypeId(_,id);
  opcode = ValidationState_t::GetIdOpcode(_,id);
  bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
  if (((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20)) &&
     (iVar3 = spvOpcodeIsConstant(opcode), iVar3 != 0)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
  std::operator<<((ostream *)&DStack_1f8,
                  "expected Intersection ID to be a constant 32-bit int scalar");
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateIntersectionId(ValidationState_t& _,
                                    const Instruction* inst,
                                    uint32_t intersection_index) {
  const uint32_t intersection_id =
      inst->GetOperandAs<uint32_t>(intersection_index);
  const uint32_t intersection_type = _.GetTypeId(intersection_id);
  const spv::Op intersection_opcode = _.GetIdOpcode(intersection_id);
  if (!_.IsIntScalarType(intersection_type) ||
      _.GetBitWidth(intersection_type) != 32 ||
      !spvOpcodeIsConstant(intersection_opcode)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "expected Intersection ID to be a constant 32-bit int scalar";
  }

  return SPV_SUCCESS;
}